

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,xpath_node *xn,xpath_allocator *alloc,
          byte once)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_node xVar3;
  xml_node_struct *n;
  
  xVar3 = xpath_node::node(xn);
  if (xVar3._root != (xml_node_struct *)0x0) {
    xVar3 = xpath_node::node(xn);
    pxVar1 = (xVar3._root)->first_child;
    while ((n = pxVar1, n != (xml_node_struct *)0x0 &&
           (bVar2 = step_push(this,ns,n,alloc), (bVar2 & once) == 0))) {
      pxVar1 = n->first_child;
      if (n->first_child == (xml_node_struct *)0x0) {
        while (pxVar1 = n->next_sibling, n->next_sibling == (xml_node_struct *)0x0) {
          n = n->parent;
          if (n == xVar3._root) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}